

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int libssh2_sftp_readdir_ex
              (LIBSSH2_SFTP_HANDLE *hnd,char *buffer,size_t buffer_maxlen,char *longentry,
              size_t longentry_maxlen,LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  ssize_t rc;
  LIBSSH2_SFTP_ATTRIBUTES *attrs_local;
  size_t longentry_maxlen_local;
  char *longentry_local;
  size_t buffer_maxlen_local;
  char *buffer_local;
  LIBSSH2_SFTP_HANDLE *hnd_local;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    hnd_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time = sftp_readdir(hnd,buffer,buffer_maxlen,longentry,longentry_maxlen,attrs);
      if (((entry_time != -0x25) || (hnd->sftp->channel->session == (LIBSSH2_SESSION *)0x0)) ||
         (hnd->sftp->channel->session->api_block_mode == 0)) break;
      iVar1 = _libssh2_wait_socket(hnd->sftp->channel->session,start_time);
      entry_time = (time_t)iVar1;
    } while (entry_time == 0);
    hnd_local._4_4_ = (int)entry_time;
  }
  return hnd_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_readdir_ex(LIBSSH2_SFTP_HANDLE *hnd, char *buffer,
                        size_t buffer_maxlen, char *longentry,
                        size_t longentry_maxlen,
                        LIBSSH2_SFTP_ATTRIBUTES *attrs)
{
    ssize_t rc;
    if(!hnd)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, hnd->sftp->channel->session,
                 sftp_readdir(hnd, buffer, buffer_maxlen, longentry,
                              longentry_maxlen, attrs));
    return (int)rc;  /* FIXME: -> ssize_t */
}